

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O1

void __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::load_from_file
          (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
           *this,char *filename)

{
  long lVar1;
  char cVar2;
  istream *piVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  vector<double,_std::allocator<double>_> line_of_heat_map;
  string temp;
  double point;
  ifstream in;
  stringstream lineSS;
  undefined1 auStack_418 [8];
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *local_410;
  void *local_408;
  iterator iStack_400;
  double *local_3f8;
  char *local_3e8;
  long local_3e0;
  char local_3d8;
  undefined7 uStack_3d7;
  double local_3c8;
  double local_3c0 [4];
  int aiStack_3a0 [122];
  long local_1b8 [2];
  ostream local_1a8 [16];
  int aiStack_198 [24];
  ios_base aiStack_138 [264];
  
  local_410 = this;
  std::ifstream::ifstream(local_3c0);
  std::ifstream::open((char *)local_3c0,(_Ios_Openmode)filename);
  if (*(int *)((long)aiStack_3a0 + *(long *)((long)local_3c0[0] + -0x18)) == 0) {
    piVar3 = std::istream::_M_extract<double>(local_3c0);
    std::istream::_M_extract<double>((double *)piVar3);
    local_3e8 = &local_3d8;
    local_3e0 = 0;
    local_3d8 = '\0';
    cVar2 = std::ios::widen((char)local_3c0 + (char)*(undefined8 *)((long)local_3c0[0] + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_3c0,(string *)&local_3e8,cVar2);
    lVar1 = *(long *)((long)local_3c0[0] + -0x18);
    if (*(int *)((long)aiStack_3a0 + lVar1) == 0) {
      local_410 = (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                   *)&local_410->heat_map;
      do {
        cVar2 = std::ios::widen((char)auStack_418 + (char)lVar1 + 'X');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_3c0,(string *)&local_3e8,cVar2);
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_3e8,local_3e0);
        local_408 = (void *)0x0;
        iStack_400._M_current = (double *)0x0;
        local_3f8 = (double *)0x0;
        while (*(int *)((long)aiStack_198 + *(long *)(local_1b8[0] + -0x18)) == 0) {
          std::istream::_M_extract<double>((double *)local_1b8);
          if (iStack_400._M_current == local_3f8) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_408,iStack_400,&local_3c8);
          }
          else {
            *iStack_400._M_current = local_3c8;
            iStack_400._M_current = iStack_400._M_current + 1;
          }
        }
        if (*(int *)((long)aiStack_3a0 + *(long *)((long)local_3c0[0] + -0x18)) == 0) {
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)local_410,(value_type *)&local_408);
        }
        if (local_408 != (void *)0x0) {
          operator_delete(local_408,(long)local_3f8 - (long)local_408);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(aiStack_138);
        lVar1 = *(long *)((long)local_3c0[0] + -0x18);
      } while (*(int *)((long)aiStack_3a0 + lVar1) == 0);
    }
    std::ifstream::close();
    if (local_3e8 != &local_3d8) {
      operator_delete(local_3e8,CONCAT71(uStack_3d7,local_3d8) + 1);
    }
    std::ifstream::~ifstream(local_3c0);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"The file : ",0xb);
  poVar4 = std::operator<<((ostream *)&std::cerr,filename);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4," do not exist. The program will now terminate \n",0x2f);
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "The persistence landscape file do not exist. The program will now terminate \n";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

void Persistence_heat_maps<Scalling_of_kernels>::load_from_file(const char* filename) {
  bool dbg = false;

  std::ifstream in;
  in.open(filename);

  // checking if the file exist / if it was open.
  if (!in.good()) {
    std::cerr << "The file : " << filename << " do not exist. The program will now terminate \n";
    throw "The persistence landscape file do not exist. The program will now terminate \n";
  }

  // now we read the file one by one.

  in >> this->min_ >> this->max_;
  if (dbg) {
    std::clog << "Reading the following values of min and max : " << this->min_ << " , " << this->max_ << std::endl;
  }

  std::string temp;
  std::getline(in, temp);
  while (in.good()) {
    std::getline(in, temp);
    std::stringstream lineSS;
    lineSS << temp;

    std::vector<double> line_of_heat_map;
    while (lineSS.good()) {
      double point;

      lineSS >> point;
      line_of_heat_map.push_back(point);
      if (dbg) {
        std::clog << point << " ";
      }
    }
    if (dbg) {
      std::clog << std::endl;
      getchar();
    }

    if (in.good()) this->heat_map.push_back(line_of_heat_map);
  }
  in.close();
  if (dbg) std::clog << "Done \n";
}